

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-interleave.cc
# Opt level: O0

uint32 util_bits::InterleaveUint16(uint16 val0,uint16 val1)

{
  uint16 val1_local;
  uint16 val0_local;
  
  return CONCAT22(*(undefined2 *)(&kInterleaveLut + (long)((int)(uint)val0 >> 8) * 2),
                  *(undefined2 *)(&kInterleaveLut + (long)(int)(val0 & 0xff) * 2)) |
         (uint)*(ushort *)(&kInterleaveLut + (long)(int)(val1 & 0xff) * 2) << 1 |
         (uint)*(ushort *)(&kInterleaveLut + (long)((int)(uint)val1 >> 8) * 2) << 0x11;
}

Assistant:

uint32 InterleaveUint16(const uint16 val0, const uint16 val1) {
  return kInterleaveLut[val0 & 0xff] |
      (kInterleaveLut[val0 >> 8] << 16) |
      (kInterleaveLut[val1 & 0xff] << 1) |
      (kInterleaveLut[val1 >> 8] << 17);
}